

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.hpp
# Opt level: O2

string * glcts::PipelineStatisticsQueryUtilities::getVerifyResultValuesErrorString<int>
                   (string *__return_storage_ptr__,int value,char *value_type,uint n_expected_values
                   ,GLuint64 *expected_values,GLenum query_type,string draw_call_type_name,
                   string primitive_type_name,bool is_primitive_restart_enabled)

{
  char *pcVar1;
  ostream *poVar2;
  GLenum value_00;
  ulong uVar3;
  string local_1d8;
  stringstream log_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&log_sstream);
  poVar2 = std::operator<<(&local_1a8,"Invalid default ");
  poVar2 = std::operator<<(poVar2,value_type);
  poVar2 = std::operator<<(poVar2," query result value: found [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,value);
  poVar2 = std::operator<<(poVar2,"], expected:[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"]");
  for (uVar3 = 1; uVar3 < n_expected_values; uVar3 = uVar3 + 1) {
    poVar2 = std::operator<<(&local_1a8," or [");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"]");
  }
  poVar2 = std::operator<<(&local_1a8,", query type:[");
  getStringForEnum_abi_cxx11_
            (&local_1d8,(PipelineStatisticsQueryUtilities *)(ulong)query_type,value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"], GL_PRIMITIVE_RESTART mode:[");
  pcVar1 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (draw_call_type_name.field_2._M_local_buf[0] != '\0') {
    pcVar1 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0x27);
  poVar2 = std::operator<<(poVar2,"], draw call type:[");
  poVar2 = std::operator<<(poVar2,*(char **)draw_call_type_name._M_dataplus._M_p);
  poVar2 = std::operator<<(poVar2,"], primitive type:[");
  poVar2 = std::operator<<(poVar2,*(char **)draw_call_type_name._M_string_length);
  std::operator<<(poVar2,"].");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&log_sstream);
  return __return_storage_ptr__;
}

Assistant:

static std::string getVerifyResultValuesErrorString(VALUE_TYPE value, const char* value_type,
														unsigned int		 n_expected_values,
														const glw::GLuint64* expected_values, glw::GLenum query_type,
														std::string draw_call_type_name,
														std::string primitive_type_name,
														bool		is_primitive_restart_enabled)
	{
		std::stringstream log_sstream;

		DE_ASSERT(expected_values != DE_NULL);

		log_sstream << "Invalid default " << value_type << " query result value: found "
														   "["
					<< value << "], expected:"
								"["
					<< expected_values[0] << "]";

		for (unsigned int i = 1; i < n_expected_values; ++i)
		{
			log_sstream << " or [" << expected_values[i] << "]";
		}

		log_sstream << ", query type:"
					   "["
					<< getStringForEnum(query_type) << "], "
													   "GL_PRIMITIVE_RESTART mode:"
													   "["
					<< ((is_primitive_restart_enabled) ? "enabled" : "disabled") << "]"
																					", draw call type:"
																					"["
					<< draw_call_type_name.c_str() << "]"
													  ", primitive type:"
													  "["
					<< primitive_type_name.c_str() << "].";

		return log_sstream.str();
	}